

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

image_t * png_read(char *filename)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  FILE *pFVar5;
  image_t *piVar6;
  uchar *buffer;
  png_structp png_ptr;
  png_infop info_ptr;
  png_bytepp image;
  undefined4 extraout_var;
  image_t *extraout_RAX;
  int iVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  png_image *__filename;
  png_image *unaff_R12;
  png_image png;
  png_infop ppStack_c8;
  png_structp ppStack_c0;
  char *pcStack_b8;
  undefined1 *puStack_b0;
  png_image local_88;
  
  local_88.opaque = (png_controlp)0x0;
  local_88.message[0x2c] = '\0';
  local_88.message[0x2d] = '\0';
  local_88.message[0x2e] = '\0';
  local_88.message[0x2f] = '\0';
  local_88.message[0x30] = '\0';
  local_88.message[0x31] = '\0';
  local_88.message[0x32] = '\0';
  local_88.message[0x33] = '\0';
  local_88.message[0x34] = '\0';
  local_88.message[0x35] = '\0';
  local_88.message[0x36] = '\0';
  local_88.message[0x37] = '\0';
  local_88.message[0x38] = '\0';
  local_88.message[0x39] = '\0';
  local_88.message[0x3a] = '\0';
  local_88.message[0x3b] = '\0';
  local_88.message[0x1c] = '\0';
  local_88.message[0x1d] = '\0';
  local_88.message[0x1e] = '\0';
  local_88.message[0x1f] = '\0';
  local_88.message[0x20] = '\0';
  local_88.message[0x21] = '\0';
  local_88.message[0x22] = '\0';
  local_88.message[0x23] = '\0';
  local_88.message[0x24] = '\0';
  local_88.message[0x25] = '\0';
  local_88.message[0x26] = '\0';
  local_88.message[0x27] = '\0';
  local_88.message[0x28] = '\0';
  local_88.message[0x29] = '\0';
  local_88.message[0x2a] = '\0';
  local_88.message[0x2b] = '\0';
  local_88.message[0xc] = '\0';
  local_88.message[0xd] = '\0';
  local_88.message[0xe] = '\0';
  local_88.message[0xf] = '\0';
  local_88.message[0x10] = '\0';
  local_88.message[0x11] = '\0';
  local_88.message[0x12] = '\0';
  local_88.message[0x13] = '\0';
  local_88.message[0x14] = '\0';
  local_88.message[0x15] = '\0';
  local_88.message[0x16] = '\0';
  local_88.message[0x17] = '\0';
  local_88.message[0x18] = '\0';
  local_88.message[0x19] = '\0';
  local_88.message[0x1a] = '\0';
  local_88.message[0x1b] = '\0';
  local_88.warning_or_error = 0;
  local_88.message[0] = '\0';
  local_88.message[1] = '\0';
  local_88.message[2] = '\0';
  local_88.message[3] = '\0';
  local_88.message[4] = '\0';
  local_88.message[5] = '\0';
  local_88.message[6] = '\0';
  local_88.message[7] = '\0';
  local_88.message[8] = '\0';
  local_88.message[9] = '\0';
  local_88.message[10] = '\0';
  local_88.message[0xb] = '\0';
  local_88.height = 0;
  local_88.format = 0;
  local_88.flags = 0;
  local_88.colormap_entries = 0;
  local_88.message[0x3c] = '\0';
  local_88.message[0x3d] = '\0';
  local_88.message[0x3e] = '\0';
  local_88.message[0x3f] = '\0';
  local_88._100_4_ = 0;
  local_88.version = 1;
  local_88.width = 0;
  pFVar5 = fopen(filename,"rb");
  if (pFVar5 == (FILE *)0x0) {
    png_read_cold_3();
  }
  else {
    png_image_begin_read_from_stdio(&local_88,(FILE *)pFVar5);
    if ((local_88._32_8_ & 2) == 0) {
      local_88.format = 3;
      piVar6 = (image_t *)malloc(0x18);
      piVar6->width = local_88.width;
      piVar6->height = local_88.height;
      piVar6->format = 0xffffffff;
      buffer = (uchar *)malloc((ulong)(local_88.width * local_88.height * 4));
      piVar6->data = buffer;
      png_image_finish_read(&local_88,(png_const_colorp)0x0,buffer,0,(void *)0x0);
      unaff_R12 = &local_88;
      if ((local_88._32_8_ & 2) == 0) {
        fclose(pFVar5);
        return piVar6;
      }
      goto LAB_00110681;
    }
  }
  png_read_cold_1();
LAB_00110681:
  __filename = &local_88;
  plVar9 = (long *)filename;
  png_read_cold_2();
  pcStack_b8 = filename;
  puStack_b0 = (undefined1 *)unaff_R12;
  pFVar5 = fopen((char *)__filename,"wb");
  if (pFVar5 == (FILE *)0x0) {
    png_write_cold_1();
    piVar6 = extraout_RAX;
  }
  else {
    lVar2 = plVar9[2];
    iVar7 = 0;
    iVar4 = 6;
    if ((int)lVar2 == 7) {
      iVar4 = 0;
    }
    png_ptr = png_create_write_struct("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0)
    ;
    ppStack_c0 = png_ptr;
    png_set_compression_level(png_ptr,1);
    info_ptr = png_create_info_struct(png_ptr);
    ppStack_c8 = info_ptr;
    png_init_io(png_ptr,(png_FILE_p)pFVar5);
    png_set_IHDR(png_ptr,info_ptr,*(png_uint_32 *)(plVar9 + 1),*(png_uint_32 *)((long)plVar9 + 0xc),
                 8,iVar4,0,0,0);
    png_write_info(png_ptr,info_ptr);
    uVar8 = (ulong)*(uint *)((long)plVar9 + 0xc);
    image = (png_bytepp)malloc(uVar8 * 8);
    if (uVar8 != 0) {
      lVar1 = *plVar9;
      lVar3 = plVar9[1];
      uVar10 = 0;
      do {
        image[uVar10] = (png_byte *)((ulong)(uint)(iVar7 << ((int)lVar2 != 7) * '\x02') + lVar1);
        uVar10 = uVar10 + 1;
        iVar7 = iVar7 + (int)lVar3;
      } while (uVar8 != uVar10);
    }
    png_write_image(png_ptr,image);
    free(image);
    png_write_end(png_ptr,info_ptr);
    png_destroy_write_struct(&ppStack_c0,&ppStack_c8);
    iVar4 = fclose(pFVar5);
    piVar6 = (image_t *)CONCAT44(extraout_var,iVar4);
  }
  return piVar6;
}

Assistant:

image_t*
png_read(
    const char* filename)
{
    FILE* stream;
    image_t* image;
    png_image png = {
        .version = PNG_IMAGE_VERSION,
        .opaque = NULL
    };

    stream = fopen(filename, "rb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

#define ERR_WRAP(x) \
    x; \
    if(PNG_IMAGE_FAILED(png)) { \
        fprintf(stderr, "%s: error reading %s: %s\n", \
            argv0, filename, png.message); \
        exit(1); \
    }

    ERR_WRAP(png_image_begin_read_from_stdio(&png, stream));
    png.format = PNG_FORMAT_RGBA;

    image = malloc(sizeof(image_t));
    image->width = png.width;
    image->height = png.height;
    image->format = FORMAT_RGBA8888;
    image->data = malloc(PNG_IMAGE_SIZE(png));

    ERR_WRAP(png_image_finish_read(&png, 0, image->data, 0, NULL));
    fclose(stream);

#undef ERR_WRAP

    return image;
}